

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

bool __thiscall
jrtplib::RTPSources::CheckCollision
          (RTPSources *this,RTPInternalSourceData *srcdat,RTPAddress *senderaddress,bool isrtp)

{
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var5;
  undefined7 in_register_00000009;
  bool bVar6;
  
  uVar4 = CONCAT71(in_register_00000009,isrtp) & 0xffffffff;
  if (*(char *)((long)&(srcdat->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject +
               (uVar4 ^ 0x249)) == '\0') {
    if ((&(srcdat->super_RTPSourceData).isrtpaddrset)[isrtp] != true) {
LAB_0011e008:
      if (isrtp) {
        if (senderaddress == (RTPAddress *)0x0) {
          pRVar1 = (srcdat->super_RTPSourceData).rtpaddr;
          if (pRVar1 != (RTPAddress *)0x0) {
            pRVar2 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
            }
            else {
              (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
            }
            (srcdat->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
          }
        }
        else {
          iVar3 = (**senderaddress->_vptr_RTPAddress)
                            (senderaddress,(srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr);
          if ((RTPAddress *)CONCAT44(extraout_var,iVar3) == (RTPAddress *)0x0) goto LAB_0011e1da;
          pRVar1 = (srcdat->super_RTPSourceData).rtpaddr;
          if (pRVar1 != senderaddress && pRVar1 != (RTPAddress *)0x0) {
            pRVar2 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
            }
            else {
              (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
            }
          }
          (srcdat->super_RTPSourceData).rtpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar3);
        }
        (srcdat->super_RTPSourceData).isrtpaddrset = true;
      }
      else {
        if (senderaddress == (RTPAddress *)0x0) {
          pRVar1 = (srcdat->super_RTPSourceData).rtcpaddr;
          if (pRVar1 != (RTPAddress *)0x0) {
            pRVar2 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
            }
            else {
              (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
            }
            (srcdat->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
          }
        }
        else {
          iVar3 = (**senderaddress->_vptr_RTPAddress)
                            (senderaddress,(srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr);
          if ((RTPAddress *)CONCAT44(extraout_var_00,iVar3) == (RTPAddress *)0x0) goto LAB_0011e1da;
          pRVar1 = (srcdat->super_RTPSourceData).rtcpaddr;
          if (pRVar1 != senderaddress && pRVar1 != (RTPAddress *)0x0) {
            pRVar2 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
            }
            else {
              (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
            }
          }
          (srcdat->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var_00,iVar3);
        }
        (srcdat->super_RTPSourceData).isrtcpaddrset = true;
      }
      goto LAB_0011e1da;
    }
    pRVar1 = (&(srcdat->super_RTPSourceData).rtpaddr)[uVar4];
    if (pRVar1 == (RTPAddress *)0x0) {
      if (senderaddress == (RTPAddress *)0x0) {
        if (isrtp) {
          RTPInternalSourceData::SetRTPDataAddress(srcdat,(RTPAddress *)0x0);
          return false;
        }
        RTPInternalSourceData::SetRTCPDataAddress(srcdat,(RTPAddress *)0x0);
        return false;
      }
    }
    else {
      iVar3 = (*pRVar1->_vptr_RTPAddress[2])(pRVar1,senderaddress);
      if ((char)iVar3 != '\0') goto LAB_0011e008;
    }
    pp_Var5 = (this->super_RTPMemoryObject)._vptr_RTPMemoryObject;
LAB_0011e104:
    (*pp_Var5[4])(this,srcdat,senderaddress,(ulong)isrtp);
    bVar6 = true;
  }
  else {
    pRVar1 = (&(srcdat->super_RTPSourceData).rtpaddr)[!isrtp];
    if (pRVar1 == (RTPAddress *)0x0) {
      if (senderaddress != (RTPAddress *)0x0) goto LAB_0011e07a;
    }
    else {
      iVar3 = (*pRVar1->_vptr_RTPAddress[1])(pRVar1,senderaddress);
      if ((char)iVar3 == '\0') {
LAB_0011e07a:
        pp_Var5 = (this->super_RTPMemoryObject)._vptr_RTPMemoryObject;
        goto LAB_0011e104;
      }
    }
LAB_0011e1da:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool RTPSources::CheckCollision(RTPInternalSourceData *srcdat,const RTPAddress *senderaddress,bool isrtp)
{
	bool isset,otherisset;
	const RTPAddress *addr,*otheraddr;
	
	if (isrtp)
	{
		isset = srcdat->IsRTPAddressSet();
		addr = srcdat->GetRTPDataAddress();
		otherisset = srcdat->IsRTCPAddressSet();
		otheraddr = srcdat->GetRTCPDataAddress();
	}
	else
	{
		isset = srcdat->IsRTCPAddressSet();
		addr = srcdat->GetRTCPDataAddress();
		otherisset = srcdat->IsRTPAddressSet();
		otheraddr = srcdat->GetRTPDataAddress();
	}

	if (!isset)
	{
		if (otherisset) // got other address, can check if it comes from same host
		{
			if (otheraddr == 0) // other came from our own session
			{
				if (senderaddress != 0)
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, store it

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
			else
			{
				if (!otheraddr->IsFromSameHost(senderaddress))
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, comes from same host, store the address

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
		}
		else // no other address, store this one
		{
			if (isrtp)
				srcdat->SetRTPDataAddress(senderaddress);
			else
				srcdat->SetRTCPDataAddress(senderaddress);
		}
	}
	else // already got an address
	{
		if (addr == 0)
		{
			if (senderaddress != 0)
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
		else
		{
			if (!addr->IsSameAddress(senderaddress))
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
	}
	
	return false;
}